

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O3

Value * __thiscall
wabt::Decompiler::Set<(wabt::ExprType)19>
          (Value *__return_storage_ptr__,Decompiler *this,Value *child,
          VarExpr<(wabt::ExprType)19> *ve)

{
  string_view sVar1;
  string s;
  char *local_50;
  size_type local_48;
  char local_40 [16];
  
  if ((ve->var).type_ == Name) {
    sVar1 = VarName(this,*(string_view *)&(ve->var).field_2);
    local_48 = 0;
    local_40[0] = '\0';
    local_50 = local_40;
    std::__cxx11::string::reserve((ulong)&local_50);
    std::__cxx11::string::append((char *)&local_50,(ulong)sVar1.data_);
    std::__cxx11::string::append((char *)&local_50,0x1a515a);
    sVar1.size_ = local_48;
    sVar1.data_ = local_50;
    WrapChild(__return_storage_ptr__,this,child,sVar1,(string_view)ZEXT816(0x1a5171),Assign);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("is_name()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/ir.h",0x39
                ,"const std::string &wabt::Var::name() const");
}

Assistant:

Value Set(Value& child, const VarExpr<T>& ve) {
    return WrapChild(child, VarName(ve.var.name()) + " = ", "", Precedence::Assign);
  }